

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_iv_check(nghttp2_settings_entry *iv,size_t niv)

{
  ulong local_28;
  size_t i;
  size_t niv_local;
  nghttp2_settings_entry *iv_local;
  
  local_28 = 0;
  do {
    if (niv <= local_28) {
      return 1;
    }
    switch(iv[local_28].settings_id) {
    case 1:
      break;
    case 2:
      if ((iv[local_28].value != 0) && (iv[local_28].value != 1)) {
        return 0;
      }
      break;
    case 3:
      break;
    case 4:
      if (0x7fffffff < iv[local_28].value) {
        return 0;
      }
      break;
    case 5:
      if ((iv[local_28].value < 0x4000) || (0xffffff < iv[local_28].value)) {
        return 0;
      }
      break;
    case 6:
      break;
    case 8:
      if ((iv[local_28].value != 0) && (iv[local_28].value != 1)) {
        return 0;
      }
      break;
    case 9:
      if ((iv[local_28].value != 0) && (iv[local_28].value != 1)) {
        return 0;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int nghttp2_iv_check(const nghttp2_settings_entry *iv, size_t niv) {
  size_t i;
  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:
      if (iv[i].value != 0 && iv[i].value != 1) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      if (iv[i].value > (uint32_t)NGHTTP2_MAX_WINDOW_SIZE) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
      if (iv[i].value < NGHTTP2_MAX_FRAME_SIZE_MIN ||
          iv[i].value > NGHTTP2_MAX_FRAME_SIZE_MAX) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
      if (iv[i].value != 0 && iv[i].value != 1) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
      if (iv[i].value != 0 && iv[i].value != 1) {
        return 0;
      }
      break;
    }
  }
  return 1;
}